

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_bezier.cpp
# Opt level: O2

bool __thiscall
ON_Line::GetTightBoundingBox(ON_Line *this,ON_BoundingBox *tight_bbox,bool bGrowBox,ON_Xform *xform)

{
  bool bVar1;
  undefined7 in_register_00000011;
  uint bGrowBox_00;
  ON_3dPoint *P_00;
  ON_3dPoint P;
  ON_3dPoint local_48;
  
  P_00 = &P;
  bGrowBox_00 = 0;
  if ((int)CONCAT71(in_register_00000011,bGrowBox) != 0) {
    bVar1 = ON_BoundingBox::IsValid(tight_bbox);
    bGrowBox_00 = (uint)bVar1;
  }
  if (xform != (ON_Xform *)0x0) {
    bVar1 = ON_Xform::IsIdentity(xform,0.0);
    if (!bVar1) {
      ON_Xform::operator*(&P,xform,&this->from);
      ON_BoundingBox::Set(tight_bbox,&P,bGrowBox_00);
      ON_Xform::operator*(&local_48,xform,&this->to);
      P.z = local_48.z;
      P.x = local_48.x;
      P.y = local_48.y;
      goto LAB_003faf2f;
    }
  }
  ON_BoundingBox::Set(tight_bbox,&this->from,bGrowBox_00);
  P_00 = &this->to;
LAB_003faf2f:
  ON_BoundingBox::Set(tight_bbox,P_00,1);
  return true;
}

Assistant:

bool ON_Line::GetTightBoundingBox( 
		ON_BoundingBox& tight_bbox, 
    bool bGrowBox,
		const ON_Xform* xform
    ) const
{
  if ( bGrowBox && !tight_bbox.IsValid() )
  {
    bGrowBox = false;
  }

  if ( xform && !xform->IsIdentity() )
  {
    ON_3dPoint P = (*xform)*from;
    tight_bbox.Set(P,bGrowBox);
    bGrowBox = true;
    P = (*xform)*to;
    tight_bbox.Set(P,bGrowBox);
  }
  else
  {
    tight_bbox.Set(from,bGrowBox);
    bGrowBox = true;
    tight_bbox.Set(to,bGrowBox);
  }

  return (0!=bGrowBox);
}